

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

LY_ERR ly_pattern_match(ly_ctx *ctx,char *pattern,char *string,uint32_t str_len,pcre2_code_8 **pcode
                       )

{
  LY_ERR LVar1;
  size_t sVar2;
  ly_err_item *plStack_50;
  LY_ERR ret__;
  ly_err_item *err;
  pcre2_code_8 *code;
  pcre2_code_8 **pppStack_38;
  LY_ERR r;
  pcre2_code_8 **pcode_local;
  char *pcStack_28;
  uint32_t str_len_local;
  char *string_local;
  char *pattern_local;
  ly_ctx *ctx_local;
  
  plStack_50 = (ly_err_item *)0x0;
  pppStack_38 = pcode;
  pcode_local._4_4_ = str_len;
  pcStack_28 = string;
  string_local = pattern;
  pattern_local = (char *)ctx;
  if ((pattern == (char *)0x0) &&
     ((pcode == (pcre2_code_8 **)0x0 || (*pcode == (pcre2_code_8 *)0x0)))) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","pattern || (pcode && *pcode)",
           "ly_pattern_match");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if (string == (char *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","string","ly_pattern_match");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else {
    if ((pcode == (pcre2_code_8 **)0x0) || (*pcode == (pcre2_code_8 *)0x0)) {
      LVar1 = lys_compile_type_pattern_check(ctx,pattern,(pcre2_code_8 **)&err);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
    }
    else {
      err = (ly_err_item *)*pcode;
    }
    if (pcode_local._4_4_ == 0) {
      sVar2 = strlen(pcStack_28);
      pcode_local._4_4_ = (uint32_t)sVar2;
    }
    code._4_4_ = ly_pattern_code_match
                           ((pcre2_code_8 *)err,pcStack_28,(ulong)pcode_local._4_4_,
                            &stack0xffffffffffffffb0);
    if ((code._4_4_ == LY_SUCCESS) || (code._4_4_ == LY_ENOT)) {
      if ((pppStack_38 == (pcre2_code_8 **)0x0) || (*pppStack_38 != (pcre2_code_8 *)0x0)) {
        if ((pppStack_38 == (pcre2_code_8 **)0x0) || (*pppStack_38 == (pcre2_code_8 *)0x0)) {
          pcre2_code_free_8(err);
        }
      }
      else {
        *pppStack_38 = (pcre2_code_8 *)err;
      }
      ctx_local._4_4_ = code._4_4_;
    }
    else {
      ly_err_print((ly_ctx *)pattern_local,plStack_50);
      ly_err_free(plStack_50);
      ctx_local._4_4_ = code._4_4_;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_pattern_match(const struct ly_ctx *ctx, const char *pattern, const char *string, uint32_t str_len, pcre2_code **pcode)
{
    LY_ERR r;
    pcre2_code *code;
    struct ly_err_item *err = NULL;

    LY_CHECK_ARG_RET(ctx, pattern || (pcode && *pcode), string, LY_EINVAL);

    if (pcode && *pcode) {
        /* use precompiled pattern */
        code = *pcode;
    } else {
        /* compile the pattern */
        LY_CHECK_RET(lys_compile_type_pattern_check(ctx, pattern, &code));
    }

    /* match */
    if (!str_len) {
        str_len = strlen(string);
    }
    r = ly_pattern_code_match(code, string, str_len, &err);
    if (r && (r != LY_ENOT)) {
        ly_err_print(ctx, err);
        ly_err_free(err);
        return r;
    }

    if (pcode && !*pcode) {
        *pcode = code;
    } else if (!pcode || !*pcode) {
        pcre2_code_free(code);
    }
    return r;
}